

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O0

void __thiscall S2Builder::set_label(S2Builder *this,Label label)

{
  Label LVar1;
  ostream *poVar2;
  reference pvVar3;
  S2LogMessage local_28;
  S2LogMessageVoidify local_15;
  Label local_14;
  S2Builder *pSStack_10;
  Label label_local;
  S2Builder *this_local;
  
  local_14 = label;
  pSStack_10 = this;
  if (-1 < label) {
    std::vector<int,_std::allocator<int>_>::resize(&this->label_set_,1);
    LVar1 = local_14;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&this->label_set_,0);
    *pvVar3 = LVar1;
    this->label_set_modified_ = true;
    return;
  }
  S2FatalLogMessage::S2FatalLogMessage
            ((S2FatalLogMessage *)&local_28,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder.cc"
             ,0x131,kFatal,(ostream *)&std::cerr);
  poVar2 = S2LogMessage::stream(&local_28);
  poVar2 = std::operator<<(poVar2,"Check failed: (label) >= (0) ");
  S2LogMessageVoidify::operator&(&local_15,poVar2);
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_28);
}

Assistant:

void S2Builder::set_label(Label label) {
  S2_DCHECK_GE(label, 0);
  label_set_.resize(1);
  label_set_[0] = label;
  label_set_modified_ = true;
}